

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<unsigned_int,unsigned_int>
          (string *__return_storage_ptr__,internal *this,uint *value,uint *param_2)

{
  uint *param_1_local;
  uint *value_local;
  
  PrintToString<unsigned_int>(__return_storage_ptr__,(uint *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}